

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * cxx_abi_cxx11_(void)

{
  char *pcVar1;
  allocator *paVar2;
  string *in_RDI;
  allocator local_a;
  allocator local_9;
  
  pcVar1 = getenv("CXX");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "clang++";
    paVar2 = &local_a;
  }
  else {
    paVar2 = &local_9;
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar2);
  return in_RDI;
}

Assistant:

std::string cxx() {
  if (auto cpp = std::getenv("CXX")) {
    return cpp;
  }

#if defined(__CLANG__)
  return "clang++";
#elif defined(__GCC__)
  return "g++";
#elif defined(__MSVC__)
#if defined(__clang__)
  return "clang-cl";
#else
  return "cl";
#endif
#endif
}